

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O0

int duckdb::UnaryLambdaWrapper::
    Operation<IntToMinMaxCast(duckdb::Vector&,duckdb::Vector&,unsigned_long,duckdb::CastParameters&)::__0,int,int>
              (int input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  int32_t iVar1;
  anon_class_16_2_ee34707b *fun;
  int32_t in_stack_000000ac;
  anon_class_16_2_ee34707b *in_stack_000000b0;
  
  iVar1 = IntToMinMaxCast::anon_class_16_2_ee34707b::operator()(in_stack_000000b0,in_stack_000000ac)
  ;
  return iVar1;
}

Assistant:

static inline RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		auto fun = (FUNC *)dataptr;
		return (*fun)(input);
	}